

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_External_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  OSTEI_HRR_Algorithm_Base *pOVar5;
  _Type aiVar6;
  pointer pcVar7;
  uint uVar8;
  RRStepType step;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  uint uVar11;
  undefined1 local_1a8 [32];
  undefined1 local_188;
  undefined7 uStack_187;
  undefined8 uStack_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  undefined8 uStack_160;
  undefined1 local_158 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  string local_d8;
  string local_b8;
  DAM local_98;
  DAM local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pOVar5 = this->hrr_algo_;
  aiVar6 = *(_Type *)(am->qam)._M_elems;
  local_108 = &local_f8;
  local_e8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  paVar2 = &local_70.tag.field_2;
  if (local_108 == &local_f8) {
    local_70.tag.field_2._8_8_ = local_f8._8_8_;
    local_70.tag._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_70.tag._M_dataplus._M_p = (pointer)local_108;
  }
  local_70.tag._M_string_length = local_100;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_108 = &local_f8;
  local_70.dam._M_elems = aiVar6;
  step = OSTEI_HRR_Algorithm_Base::GetBraRRStep(pOVar5,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.tag._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.tag._M_dataplus._M_p);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"HRR_",4);
  RRStepTypeToStr_abi_cxx11_((string *)local_158,step);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_158._0_8_,local_158._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
  local_1a8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                 [(am->qam)._M_elems[0]];
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_1a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"_",1);
  local_1a8[0] = "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                 [(am->qam)._M_elems[1]];
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_1a8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(\n",2);
  pcVar1 = local_158 + 0x10;
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"",0);
  local_158._16_4_ = 0x525248;
  local_158._8_8_ = 3;
  local_158._0_8_ = pcVar1;
  ArrVarName((string *)local_1a8,am,(string *)local_158);
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),
                      CONCAT44(local_1a8._12_4_,local_1a8._8_4_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\n",2);
  if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_));
  }
  pOVar5 = local_e8->hrr_algo_;
  aiVar6 = *(_Type *)(am->qam)._M_elems;
  local_128 = &local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
  paVar2 = &local_98.tag.field_2;
  if (local_128 == &local_118) {
    local_98.tag.field_2._8_8_ = local_118._8_8_;
    local_98.tag._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.tag._M_dataplus._M_p = (pointer)local_128;
  }
  local_98.tag._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_128 = &local_118;
  local_98.dam._M_elems = aiVar6;
  OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)local_158,pOVar5,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.tag._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.tag._M_dataplus._M_p);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if ((_Rb_tree_node_base *)local_158._24_8_ != (_Rb_tree_node_base *)(local_158 + 8)) {
    p_Var10 = (_Rb_tree_node_base *)local_158._24_8_;
    do {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"",0);
      local_e8 = *(OSTEI_HRR_Writer **)(p_Var10 + 1);
      uStack_e0 = 0;
      local_48 = *(undefined8 *)((am->qam)._M_elems + 2);
      uStack_40 = 0;
      pcVar7 = (am->tag)._M_dataplus._M_p;
      local_178 = &local_168;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar7,pcVar7 + (am->tag)._M_string_length);
      local_1a8._8_4_ = (undefined4)local_48;
      local_1a8._12_4_ = (undefined4)((ulong)local_48 >> 0x20);
      local_1a8._0_4_ = (int)local_e8;
      local_1a8._4_4_ = local_e8._4_4_;
      local_1a8._16_8_ = &local_188;
      if (local_178 == &local_168) {
        uStack_180 = uStack_160;
      }
      else {
        local_1a8._16_8_ = local_178;
      }
      uStack_187 = uStack_167;
      local_188 = local_168;
      local_1a8._24_8_ = local_170;
      local_170 = 0;
      local_168 = 0;
      local_b8.field_2._M_local_buf[2] = 'R';
      local_b8.field_2._M_allocated_capacity._0_2_ = 0x5248;
      local_b8._M_string_length = 3;
      local_b8.field_2._M_local_buf[3] = '\0';
      local_178 = &local_168;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ArrVarName(&local_d8,(QAM *)local_1a8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((undefined1 *)local_1a8._16_8_ != &local_188) {
        operator_delete((void *)local_1a8._16_8_);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while (p_Var10 != (_Rb_tree_node_base *)(local_158 + 8));
  }
  std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
            ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
             local_158);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"hAB, ",5);
  iVar3 = (am->qam)._M_elems[2];
  iVar4 = (am->qam)._M_elems[3];
  uVar8 = (uint)((iVar3 + 1) * (iVar3 + 2)) >> 1;
  if (iVar3 < 0) {
    uVar8 = 0;
  }
  uVar11 = (uint)((iVar4 + 1) * (iVar4 + 2)) >> 1;
  if (iVar4 < 0) {
    uVar11 = 0;
  }
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar11 * uVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SIMINT EXTERNAL HRR ",0x14);
  RRStepTypeToStr_abi_cxx11_((string *)local_158,step);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,(am->qam)._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,(am->qam)._M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_External_(std::ostream & os, QAM am) const
{
    // call function
    RRStepType rrstep = hrr_algo_.GetBraRRStep({am[0], am[1]});
    os << indent4 << "HRR_" << RRStepTypeToStr(rrstep) << "_"
       << amchar[am[0]] << "_" << amchar[am[1]] << "(\n";

    // pointer to result buffer
    os << indent5 << "" << HRRVarName(am) << ",\n";

    // pointer to requirements
    for(const auto & it : hrr_algo_.GetBraAMReq({am[0], am[1]}))
        os << indent5 << "" << HRRVarName({it[0], it[1], am[2], am[3], am.tag}) << ",\n";

    os << indent5 << "hAB, " << NCART(am[2], am[3]) << ");\n"; 

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL HRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << "\n";
}